

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O0

void vkt::sr::anon_unknown_0::MatrixCaseUtils::Evaluator<12,_8,_94>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  int in_ECX;
  Matrix<float,_2,_3> *extraout_RDX;
  Matrix<float,_2,_3> *extraout_RDX_00;
  Matrix<float,_2,_3> *mat;
  Matrix<float,_2,_3> *mat_00;
  VecAccess<float,_4,_3> local_a8;
  Matrix<float,_2,_3> local_90;
  Vector<float,_3> local_78 [2];
  Matrix<float,_2,_3> local_60;
  Vector<float,_3> local_48;
  Vector<float,_3> local_3c;
  undefined1 local_30 [8];
  Type in0;
  InputType in1Type_local;
  InputType in0Type_local;
  ShaderEvalContext *evalCtx_local;
  
  in0.m_data.m_data[2].m_data[0] = (float)in1Type;
  in0.m_data.m_data[2].m_data[1] = (float)in0Type;
  if (in0Type == INPUTTYPE_DYNAMIC) {
    sr::(anonymous_namespace)::MatrixCaseUtils::getInputValue<2,8>
              ((Mat3x2 *)local_30,(MatrixCaseUtils *)evalCtx,(ShaderEvalContext *)0x0,in_ECX);
    mat = extraout_RDX;
  }
  else {
    sr::(anonymous_namespace)::MatrixCaseUtils::getInputValue<0,8>
              ((Mat3x2 *)local_30,(MatrixCaseUtils *)evalCtx,(ShaderEvalContext *)0x0,in_ECX);
    mat = extraout_RDX_00;
  }
  sr::(anonymous_namespace)::MatrixCaseUtils::decrement<float,2,3>
            (&local_60,(MatrixCaseUtils *)local_30,mat);
  reduceToVec3((MatrixCaseUtils *)&local_48,&local_60);
  sr::(anonymous_namespace)::MatrixCaseUtils::decrement<float,2,3>
            (&local_90,(MatrixCaseUtils *)local_30,mat_00);
  reduceToVec3((MatrixCaseUtils *)local_78,&local_90);
  tcu::operator+((tcu *)&local_3c,&local_48,local_78);
  tcu::Vector<float,_4>::xyz(&local_a8,&evalCtx->color);
  tcu::VecAccess<float,_4,_3>::operator=(&local_a8,&local_3c);
  tcu::Matrix<float,_2,_3>::~Matrix(&local_90);
  tcu::Matrix<float,_2,_3>::~Matrix(&local_60);
  tcu::Matrix<float,_2,_3>::~Matrix((Matrix<float,_2,_3> *)local_30);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		DE_UNREF(in1Type);
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);

		// modifying reduction: sum modified value too
		evalCtx.color.xyz() = reduceToVec3(decrement(in0)) + reduceToVec3(decrement(in0));
	}